

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yajl_gen.c
# Opt level: O3

yajl_gen_status yajl_gen_integer(yajl_gen g,longlong number)

{
  yajl_print_t p_Var1;
  void *pvVar2;
  yajl_gen_state yVar3;
  size_t sVar4;
  uint _i;
  uint uVar5;
  char *pcVar6;
  char i [32];
  char acStack_58 [40];
  
  switch(g->state[g->depth]) {
  case yajl_gen_map_start:
  case yajl_gen_map_key:
    return yajl_gen_keys_must_be_strings;
  case yajl_gen_map_val:
    (*g->print)(g->ctx,":",1);
    if ((g->flags & 1) != 0) {
      pcVar6 = " ";
LAB_0010510b:
      (*g->print)(g->ctx,pcVar6,1);
    }
    break;
  case yajl_gen_in_array:
    (*g->print)(g->ctx,",",1);
    if ((g->flags & 1) != 0) {
      pcVar6 = "\n";
      goto LAB_0010510b;
    }
    break;
  case yajl_gen_complete:
    return yajl_gen_generation_complete;
  case yajl_gen_error:
    return yajl_gen_in_error_state;
  }
  if (((g->flags & 1) != 0) && (g->state[g->depth] != yajl_gen_map_val && (ulong)g->depth != 0)) {
    uVar5 = 0;
    do {
      p_Var1 = g->print;
      pvVar2 = g->ctx;
      pcVar6 = g->indentString;
      sVar4 = strlen(pcVar6);
      (*p_Var1)(pvVar2,pcVar6,sVar4 & 0xffffffff);
      uVar5 = uVar5 + 1;
    } while (uVar5 < g->depth);
  }
  sprintf(acStack_58,"%lld",number);
  p_Var1 = g->print;
  pvVar2 = g->ctx;
  sVar4 = strlen(acStack_58);
  (*p_Var1)(pvVar2,acStack_58,sVar4 & 0xffffffff);
  uVar5 = g->depth;
  yVar3 = g->state[uVar5];
  switch(yVar3) {
  case yajl_gen_start:
    g->state[uVar5] = yajl_gen_complete;
    if ((g->flags & 1) == 0) {
      return yajl_gen_status_ok;
    }
    goto LAB_001051ed;
  case yajl_gen_map_start:
  case yajl_gen_map_key:
    yVar3 = yajl_gen_map_val;
    break;
  case yajl_gen_map_val:
    yVar3 = yajl_gen_map_key;
    break;
  case yajl_gen_array_start:
    yVar3 = yajl_gen_in_array;
    break;
  default:
    goto switchD_001051b2_default;
  }
  g->state[uVar5] = yVar3;
switchD_001051b2_default:
  if (((g->flags & 1) != 0) && (yVar3 == yajl_gen_complete)) {
LAB_001051ed:
    (*g->print)(g->ctx,"\n",1);
  }
  return yajl_gen_status_ok;
}

Assistant:

yajl_gen_status
yajl_gen_integer(yajl_gen g, long long int number)
{
    char i[32];
    ENSURE_VALID_STATE; ENSURE_NOT_KEY; INSERT_SEP; INSERT_WHITESPACE;
    sprintf(i, "%lld", number);
    g->print(g->ctx, i, (unsigned int)strlen(i));
    APPENDED_ATOM;
    FINAL_NEWLINE;
    return yajl_gen_status_ok;
}